

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestUtility.cpp
# Opt level: O1

void assert::expect_exception(function<void_()> *func,string *msg)

{
  pointer pcVar1;
  undefined8 uVar2;
  pointer unaff_R14;
  string local_38;
  
  if ((func->super__Function_base)._M_manager != (_Manager_type)0x0) {
    (*func->_M_invoker)((_Any_data *)func);
    pcVar1 = (msg->_M_dataplus)._M_p;
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_38,pcVar1,pcVar1 + msg->_M_string_length);
    is_true(false,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  uVar2 = std::__throw_bad_function_call();
  if (local_38._M_dataplus._M_p != unaff_R14) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  _Unwind_Resume(uVar2);
}

Assistant:

void expect_exception(const std::function<void(void)>& func, std::string msg)
    {
        bool exception_occured = false;

        try
        {
            func();
        }
        catch (...)
        {
            exception_occured = true;
        }

        is_true(exception_occured, msg);
    }